

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electron.cpp
# Opt level: O3

void __thiscall
Electron::ConcreteMachine<true>::set_activity_observer
          (ConcreteMachine<true> *this,Observer *observer)

{
  Plus3 *this_00;
  
  this->activity_observer_ = observer;
  if (observer != (Observer *)0x0) {
    (*observer->_vptr_Observer[2])(observer,&this->caps_led,1);
    (*this->activity_observer_->_vptr_Observer[4])
              (this->activity_observer_,&this->caps_led,(ulong)this->caps_led_state_);
  }
  this_00 = (this->plus3_)._M_t.
            super___uniq_ptr_impl<Electron::Plus3,_std::default_delete<Electron::Plus3>_>._M_t.
            super__Tuple_impl<0UL,_Electron::Plus3_*,_std::default_delete<Electron::Plus3>_>.
            super__Head_base<0UL,_Electron::Plus3_*,_false>._M_head_impl;
  if (this_00 != (Plus3 *)0x0) {
    Plus3::set_activity_observer(this_00,observer);
  }
  SCSI::Bus::set_activity_observer(&this->scsi_bus_,observer);
  return;
}

Assistant:

void set_activity_observer(Activity::Observer *observer) final {
			activity_observer_ = observer;
			if(activity_observer_) {
				activity_observer_->register_led(caps_led, Activity::Observer::LEDPresentation::Persistent);
				activity_observer_->set_led_status(caps_led, caps_led_state_);
			}

			if(plus3_) {
				plus3_->set_activity_observer(observer);
			}

			if(has_scsi_bus) {
				scsi_bus_.set_activity_observer(observer);
			}
		}